

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z3_8x32_sse4_1
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  bool bVar1;
  bool bVar16;
  bool bVar31;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  int iVar76;
  int iVar77;
  long lVar78;
  long lVar79;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ushort uVar80;
  ushort uVar86;
  ushort uVar88;
  ulong uVar82;
  ushort uVar90;
  ushort uVar92;
  ushort uVar95;
  ushort uVar97;
  ulong uVar94;
  ushort uVar99;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar81;
  short sVar87;
  short sVar89;
  short sVar91;
  short sVar93;
  short sVar96;
  short sVar98;
  short sVar100;
  undefined1 auVar85 [16];
  int i_3;
  int i_2;
  int i_1;
  __m128i d_h [16];
  __m128i dstvec_h [16];
  __m128i d [16];
  __m128i dstvec [16];
  int mdiff;
  int jj;
  int j;
  __m128i shift;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i res16 [2];
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i c3f;
  __m128i diff;
  __m128i a_mbase_x;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_8f4;
  int local_8f0;
  int local_8ec;
  undefined8 local_8e8 [11];
  __m128i *in_stack_fffffffffffff770;
  __m128i *in_stack_fffffffffffff778;
  undefined8 local_7e8 [16];
  undefined8 local_768 [48];
  undefined8 local_5e8 [16];
  undefined8 auStack_568 [18];
  long local_4d8;
  long local_4d0;
  int local_484;
  int local_480;
  int local_47c;
  ushort local_478;
  ushort uStack_476;
  ushort uStack_474;
  ushort uStack_472;
  ushort uStack_470;
  ushort uStack_46e;
  ushort uStack_46c;
  ushort uStack_46a;
  int local_464;
  int local_460;
  int local_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ushort local_418;
  ushort uStack_416;
  ushort uStack_414;
  ushort uStack_412;
  ushort uStack_410;
  ushort uStack_40e;
  ushort uStack_40c;
  ushort uStack_40a;
  ushort local_408;
  ushort uStack_406;
  ushort uStack_404;
  ushort uStack_402;
  ushort uStack_400;
  ushort uStack_3fe;
  ushort uStack_3fc;
  ushort uStack_3fa;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  int local_3e0;
  int local_3dc;
  ulong local_3d8;
  ulong uStack_3d0;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  int local_368;
  undefined4 local_364;
  int local_360;
  long local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  int local_33c;
  undefined2 local_338;
  undefined2 local_336;
  undefined2 local_334;
  undefined1 local_331;
  undefined1 (*local_330) [16];
  undefined1 (*local_328) [16];
  undefined4 local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined4 local_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  ulong local_88;
  ulong uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  ulong local_68;
  ulong uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [3];
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30 [3];
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  
  local_33c = 8;
  local_348 = local_5e8;
  local_350 = local_7e8;
  local_364 = 6;
  local_368 = 0x27;
  local_334 = 0x10;
  local_8a = 0x10;
  local_8c = 0x10;
  local_8e = 0x10;
  local_90 = 0x10;
  local_92 = 0x10;
  local_94 = 0x10;
  local_96 = 0x10;
  local_98 = 0x10;
  local_3a8 = 0x10001000100010;
  uStack_3a0 = 0x10001000100010;
  local_331 = *(undefined1 *)(in_RDX + 0x27);
  local_30[2] = local_331;
  local_30[1] = local_331;
  local_30[0] = local_331;
  local_38[2] = local_331;
  local_38[1] = local_331;
  local_38[0] = local_331;
  local_3b8 = CONCAT17(local_331,
                       CONCAT16(local_331,
                                CONCAT15(local_331,CONCAT14(local_331,CONCAT13(local_331,local_38)))
                               ));
  uStack_3b0 = CONCAT17(local_331,
                        CONCAT16(local_331,
                                 CONCAT15(local_331,CONCAT14(local_331,CONCAT13(local_331,local_30))
                                         )));
  local_336 = 0x3f;
  local_6a = 0x3f;
  local_6c = 0x3f;
  local_6e = 0x3f;
  local_70 = 0x3f;
  local_72 = 0x3f;
  local_74 = 0x3f;
  local_76 = 0x3f;
  local_78 = 0x3f;
  local_3d8 = 0x3f003f003f003f;
  uStack_3d0 = 0x3f003f003f003f;
  local_3e0 = 0;
  local_3dc = in_R8D;
  local_360 = in_R8D;
  local_358 = in_RDX;
  local_a8 = local_3a8;
  uStack_a0 = uStack_3a0;
  local_88 = local_3d8;
  uStack_80 = uStack_3d0;
  local_48 = local_3b8;
  uStack_40 = uStack_3b0;
  local_35 = local_331;
  local_34 = local_331;
  local_33 = local_331;
  local_32 = local_331;
  local_31 = local_331;
  local_2d = local_331;
  local_2c = local_331;
  local_2b = local_331;
  local_2a = local_331;
  local_29 = local_331;
  while( true ) {
    if (local_33c <= local_3e0) goto LAB_00548255;
    iVar76 = local_3dc >> 6;
    iVar77 = local_368 - iVar76;
    local_460 = iVar77;
    local_45c = iVar76;
    if (iVar77 < 1) break;
    if (0x20 < iVar77) {
      local_460 = 0x20;
    }
    local_338 = (undefined2)local_3dc;
    local_4a = (undefined2)local_3dc;
    local_4c = (undefined2)local_3dc;
    local_4e = (undefined2)local_3dc;
    local_50 = (undefined2)local_3dc;
    local_52 = (undefined2)local_3dc;
    local_54 = (undefined2)local_3dc;
    local_56 = (undefined2)local_3dc;
    local_58 = (undefined2)local_3dc;
    local_2b8 = CONCAT26((undefined2)local_3dc,
                         CONCAT24((undefined2)local_3dc,
                                  CONCAT22((undefined2)local_3dc,(undefined2)local_3dc)));
    uStack_2b0 = CONCAT26((undefined2)local_3dc,
                          CONCAT24((undefined2)local_3dc,
                                   CONCAT22((undefined2)local_3dc,(undefined2)local_3dc)));
    local_2c8 = local_3d8;
    uStack_2c0 = uStack_3d0;
    uVar82 = local_2b8 & local_3d8;
    uVar94 = uStack_2b0 & uStack_3d0;
    local_2dc = 1;
    local_2d8._0_2_ = (ushort)uVar82;
    local_2d8._2_2_ = (ushort)(uVar82 >> 0x10);
    local_2d8._4_2_ = (ushort)(uVar82 >> 0x20);
    uStack_2d0._0_2_ = (ushort)uVar94;
    uStack_2d0._2_2_ = (ushort)(uVar94 >> 0x10);
    uStack_2d0._4_2_ = (ushort)(uVar94 >> 0x20);
    uVar80 = (ushort)local_2d8 >> 1;
    uVar86 = local_2d8._2_2_ >> 1;
    uVar88 = local_2d8._4_2_ >> 1;
    uVar90 = (ushort)(uVar82 >> 0x31);
    uVar92 = (ushort)uStack_2d0 >> 1;
    uVar95 = uStack_2d0._2_2_ >> 1;
    uVar97 = uStack_2d0._4_2_ >> 1;
    uVar99 = (ushort)(uVar94 >> 0x31);
    local_480 = 0;
    local_2d8 = uVar82;
    uStack_2d0 = uVar94;
    local_68 = local_2b8;
    uStack_60 = uStack_2b0;
    for (local_47c = 0; uVar61 = uStack_3b0, local_47c < 0x20; local_47c = local_47c + 0x10) {
      local_484 = local_460 - local_47c;
      if (local_484 < 1) {
        (&local_438)[(long)local_480 * 2] = local_3b8;
        (&uStack_430)[(long)local_480 * 2] = uVar61;
      }
      else {
        local_328 = (undefined1 (*) [16])(local_358 + iVar76 + (long)local_47c);
        local_448 = *(undefined8 *)*local_328;
        uStack_440 = *(undefined8 *)(*local_328 + 8);
        local_238 = *local_328;
        local_330 = (undefined1 (*) [16])((long)local_47c + 1 + local_358 + iVar76);
        local_458 = *(undefined8 *)*local_330;
        uStack_450 = *(undefined8 *)(*local_330 + 8);
        local_248 = *local_330;
        auVar83 = pmovzxbw(local_238,local_448);
        auVar84 = pmovzxbw(local_248,local_458);
        local_388._0_8_ = auVar84._0_8_;
        local_388._8_8_ = auVar84._8_8_;
        local_378._0_8_ = auVar83._0_8_;
        local_378._8_8_ = auVar83._8_8_;
        local_1f8 = local_388._0_8_;
        uVar68 = local_1f8;
        uStack_1f0 = local_388._8_8_;
        uVar69 = uStack_1f0;
        local_208 = local_378._0_8_;
        uVar66 = local_208;
        uStack_200 = local_378._8_8_;
        uVar67 = uStack_200;
        local_1f8._0_2_ = auVar84._0_2_;
        local_1f8._2_2_ = auVar84._2_2_;
        local_1f8._4_2_ = auVar84._4_2_;
        local_1f8._6_2_ = auVar84._6_2_;
        uStack_1f0._0_2_ = auVar84._8_2_;
        uStack_1f0._2_2_ = auVar84._10_2_;
        uStack_1f0._4_2_ = auVar84._12_2_;
        uStack_1f0._6_2_ = auVar84._14_2_;
        local_208._0_2_ = auVar83._0_2_;
        local_208._2_2_ = auVar83._2_2_;
        local_208._4_2_ = auVar83._4_2_;
        local_208._6_2_ = auVar83._6_2_;
        uStack_200._0_2_ = auVar83._8_2_;
        uStack_200._2_2_ = auVar83._10_2_;
        uStack_200._4_2_ = auVar83._12_2_;
        uStack_200._6_2_ = auVar83._14_2_;
        local_278 = local_378._0_8_;
        uStack_270 = local_378._8_8_;
        local_27c = 5;
        auVar83 = psllw(auVar83,ZEXT416(5));
        local_398 = auVar83._0_8_;
        uStack_390 = auVar83._8_8_;
        local_178 = local_398;
        uVar74 = local_178;
        uStack_170 = uStack_390;
        uVar75 = uStack_170;
        local_188 = local_3a8;
        uVar72 = local_188;
        uStack_180 = uStack_3a0;
        uVar73 = uStack_180;
        local_178._0_2_ = auVar83._0_2_;
        local_178._2_2_ = auVar83._2_2_;
        local_178._4_2_ = auVar83._4_2_;
        local_178._6_2_ = auVar83._6_2_;
        uStack_170._0_2_ = auVar83._8_2_;
        uStack_170._2_2_ = auVar83._10_2_;
        uStack_170._4_2_ = auVar83._12_2_;
        uStack_170._6_2_ = auVar83._14_2_;
        local_188._0_2_ = (short)local_3a8;
        local_188._2_2_ = (short)((ulong)local_3a8 >> 0x10);
        local_188._4_2_ = (short)((ulong)local_3a8 >> 0x20);
        local_188._6_2_ = (short)((ulong)local_3a8 >> 0x30);
        uStack_180._0_2_ = (short)uStack_3a0;
        uStack_180._2_2_ = (short)((ulong)uStack_3a0 >> 0x10);
        uStack_180._4_2_ = (short)((ulong)uStack_3a0 >> 0x20);
        uStack_180._6_2_ = (short)((ulong)uStack_3a0 >> 0x30);
        local_398._0_4_ =
             CONCAT22(local_178._2_2_ + local_188._2_2_,(short)local_178 + (short)local_188);
        local_398._0_6_ = CONCAT24(local_178._4_2_ + local_188._4_2_,(undefined4)local_398);
        local_398 = CONCAT26(local_178._6_2_ + local_188._6_2_,(undefined6)local_398);
        uStack_390._0_2_ = (short)uStack_170 + (short)uStack_180;
        uStack_390._2_2_ = uStack_170._2_2_ + uStack_180._2_2_;
        uStack_390._4_2_ = uStack_170._4_2_ + uStack_180._4_2_;
        uStack_390._6_2_ = uStack_170._6_2_ + uStack_180._6_2_;
        local_138 = CONCAT26(local_1f8._6_2_ - local_208._6_2_,
                             CONCAT24(local_1f8._4_2_ - local_208._4_2_,
                                      CONCAT22(local_1f8._2_2_ - local_208._2_2_,
                                               (short)local_1f8 - (short)local_208)));
        uStack_130 = CONCAT26(uStack_1f0._6_2_ - uStack_200._6_2_,
                              CONCAT24(uStack_1f0._4_2_ - uStack_200._4_2_,
                                       CONCAT22(uStack_1f0._2_2_ - uStack_200._2_2_,
                                                (short)uStack_1f0 - (short)uStack_200)));
        local_148 = CONCAT26(uVar90,CONCAT24(uVar88,CONCAT22(uVar86,uVar80)));
        uStack_140 = CONCAT26(uVar99,CONCAT24(uVar97,CONCAT22(uVar95,uVar92)));
        sVar81 = ((short)local_1f8 - (short)local_208) * uVar80;
        sVar87 = (local_1f8._2_2_ - local_208._2_2_) * uVar86;
        sVar89 = (local_1f8._4_2_ - local_208._4_2_) * uVar88;
        sVar91 = (local_1f8._6_2_ - local_208._6_2_) * uVar90;
        sVar93 = ((short)uStack_1f0 - (short)uStack_200) * uVar92;
        sVar96 = (uStack_1f0._2_2_ - uStack_200._2_2_) * uVar95;
        sVar98 = (uStack_1f0._4_2_ - uStack_200._4_2_) * uVar97;
        sVar100 = (uStack_1f0._6_2_ - uStack_200._6_2_) * uVar99;
        local_1a8 = CONCAT26(sVar91,CONCAT24(sVar89,CONCAT22(sVar87,sVar81)));
        uStack_1a0 = CONCAT26(sVar100,CONCAT24(sVar98,CONCAT22(sVar96,sVar93)));
        local_198 = local_398;
        uStack_190 = uStack_390;
        local_408 = (short)local_178 + (short)local_188 + sVar81;
        uStack_406 = local_178._2_2_ + local_188._2_2_ + sVar87;
        uStack_404 = local_178._4_2_ + local_188._4_2_ + sVar89;
        uStack_402 = local_178._6_2_ + local_188._6_2_ + sVar91;
        uStack_400 = (short)uStack_170 + (short)uStack_180 + sVar93;
        uStack_3fe = uStack_170._2_2_ + uStack_180._2_2_ + sVar96;
        uStack_3fc = uStack_170._4_2_ + uStack_180._4_2_ + sVar98;
        uStack_3fa = uStack_170._6_2_ + uStack_180._6_2_ + sVar100;
        local_2f8 = CONCAT26(uStack_402,CONCAT24(uStack_404,CONCAT22(uStack_406,local_408)));
        uStack_2f0 = CONCAT26(uStack_3fa,CONCAT24(uStack_3fc,CONCAT22(uStack_3fe,uStack_400)));
        local_2fc = 5;
        local_408 = local_408 >> 5;
        uStack_406 = uStack_406 >> 5;
        uStack_404 = uStack_404 >> 5;
        uStack_402 = uStack_402 >> 5;
        uStack_400 = uStack_400 >> 5;
        uStack_3fe = uStack_3fe >> 5;
        uStack_3fc = uStack_3fc >> 5;
        uStack_3fa = uStack_3fa >> 5;
        auVar83 = *local_328 >> 0x40;
        local_258._0_8_ = SUB168(*local_328,8);
        local_378 = pmovzxbw(auVar83,local_258._0_8_);
        auVar84 = *local_330 >> 0x40;
        local_268._0_8_ = SUB168(*local_330,8);
        local_388 = pmovzxbw(auVar84,local_268._0_8_);
        local_218 = local_388._0_8_;
        uVar63 = local_218;
        uStack_210 = local_388._8_8_;
        uVar64 = uStack_210;
        local_228 = local_378._0_8_;
        uVar61 = local_228;
        uStack_220 = local_378._8_8_;
        uVar62 = uStack_220;
        local_218._0_2_ = local_388._0_2_;
        local_218._2_2_ = local_388._2_2_;
        local_218._4_2_ = local_388._4_2_;
        local_218._6_2_ = local_388._6_2_;
        uStack_210._0_2_ = local_388._8_2_;
        uStack_210._2_2_ = local_388._10_2_;
        uStack_210._4_2_ = local_388._12_2_;
        uStack_210._6_2_ = local_388._14_2_;
        local_228._0_2_ = local_378._0_2_;
        local_228._2_2_ = local_378._2_2_;
        local_228._4_2_ = local_378._4_2_;
        local_228._6_2_ = local_378._6_2_;
        uStack_220._0_2_ = local_378._8_2_;
        uStack_220._2_2_ = local_378._10_2_;
        uStack_220._4_2_ = local_378._12_2_;
        uStack_220._6_2_ = local_378._14_2_;
        local_3c8 = (short)local_218 - (short)local_228;
        sStack_3c6 = local_218._2_2_ - local_228._2_2_;
        sStack_3c4 = local_218._4_2_ - local_228._4_2_;
        sStack_3c2 = local_218._6_2_ - local_228._6_2_;
        sStack_3c0 = (short)uStack_210 - (short)uStack_220;
        sStack_3be = uStack_210._2_2_ - uStack_220._2_2_;
        sStack_3bc = uStack_210._4_2_ - uStack_220._4_2_;
        sStack_3ba = uStack_210._6_2_ - uStack_220._6_2_;
        local_298 = local_378._0_8_;
        uStack_290 = local_378._8_8_;
        local_29c = 5;
        auVar85 = psllw(local_378,ZEXT416(5));
        local_398 = auVar85._0_8_;
        uStack_390 = auVar85._8_8_;
        local_1b8 = local_398;
        uVar70 = local_1b8;
        uStack_1b0 = uStack_390;
        uVar71 = uStack_1b0;
        local_1c8 = local_3a8;
        uStack_1c0 = uStack_3a0;
        local_1b8._0_2_ = auVar85._0_2_;
        local_1b8._2_2_ = auVar85._2_2_;
        local_1b8._4_2_ = auVar85._4_2_;
        local_1b8._6_2_ = auVar85._6_2_;
        uStack_1b0._0_2_ = auVar85._8_2_;
        uStack_1b0._2_2_ = auVar85._10_2_;
        uStack_1b0._4_2_ = auVar85._12_2_;
        uStack_1b0._6_2_ = auVar85._14_2_;
        local_398._0_4_ =
             CONCAT22(local_1b8._2_2_ + local_188._2_2_,(short)local_1b8 + (short)local_188);
        local_398._0_6_ = CONCAT24(local_1b8._4_2_ + local_188._4_2_,(undefined4)local_398);
        local_398 = CONCAT26(local_1b8._6_2_ + local_188._6_2_,(undefined6)local_398);
        uStack_390._0_2_ = (short)uStack_1b0 + (short)uStack_180;
        uStack_390._2_2_ = uStack_1b0._2_2_ + uStack_180._2_2_;
        uStack_390._4_2_ = uStack_1b0._4_2_ + uStack_180._4_2_;
        uStack_390._6_2_ = uStack_1b0._6_2_ + uStack_180._6_2_;
        local_158 = CONCAT26(sStack_3c2,CONCAT24(sStack_3c4,CONCAT22(sStack_3c6,local_3c8)));
        uStack_150 = CONCAT26(sStack_3ba,CONCAT24(sStack_3bc,CONCAT22(sStack_3be,sStack_3c0)));
        local_168 = CONCAT26(uVar90,CONCAT24(uVar88,CONCAT22(uVar86,uVar80)));
        uStack_160 = CONCAT26(uVar99,CONCAT24(uVar97,CONCAT22(uVar95,uVar92)));
        local_3f8 = local_3c8 * uVar80;
        sStack_3f6 = sStack_3c6 * uVar86;
        sStack_3f4 = sStack_3c4 * uVar88;
        sStack_3f2 = sStack_3c2 * uVar90;
        sStack_3f0 = sStack_3c0 * uVar92;
        sStack_3ee = sStack_3be * uVar95;
        sStack_3ec = sStack_3bc * uVar97;
        sStack_3ea = sStack_3ba * uVar99;
        local_1e8 = CONCAT26(sStack_3f2,CONCAT24(sStack_3f4,CONCAT22(sStack_3f6,local_3f8)));
        uStack_1e0 = CONCAT26(sStack_3ea,CONCAT24(sStack_3ec,CONCAT22(sStack_3ee,sStack_3f0)));
        local_1d8 = local_398;
        uStack_1d0 = uStack_390;
        local_418 = (short)local_1b8 + (short)local_188 + local_3f8;
        uStack_416 = local_1b8._2_2_ + local_188._2_2_ + sStack_3f6;
        uStack_414 = local_1b8._4_2_ + local_188._4_2_ + sStack_3f4;
        uStack_412 = local_1b8._6_2_ + local_188._6_2_ + sStack_3f2;
        uStack_410 = (short)uStack_1b0 + (short)uStack_180 + sStack_3f0;
        uStack_40e = uStack_1b0._2_2_ + uStack_180._2_2_ + sStack_3ee;
        uStack_40c = uStack_1b0._4_2_ + uStack_180._4_2_ + sStack_3ec;
        uStack_40a = uStack_1b0._6_2_ + uStack_180._6_2_ + sStack_3ea;
        local_318 = CONCAT26(uStack_412,CONCAT24(uStack_414,CONCAT22(uStack_416,local_418)));
        uStack_310 = CONCAT26(uStack_40a,CONCAT24(uStack_40c,CONCAT22(uStack_40e,uStack_410)));
        local_31c = 5;
        local_418 = local_418 >> 5;
        uStack_416 = uStack_416 >> 5;
        uStack_414 = uStack_414 >> 5;
        uStack_412 = uStack_412 >> 5;
        uStack_410 = uStack_410 >> 5;
        uStack_40e = uStack_40e >> 5;
        uStack_40c = uStack_40c >> 5;
        uStack_40a = uStack_40a >> 5;
        local_118 = CONCAT26(uStack_402,CONCAT24(uStack_404,CONCAT22(uStack_406,local_408)));
        uStack_110 = CONCAT26(uStack_3fa,CONCAT24(uStack_3fc,CONCAT22(uStack_3fe,uStack_400)));
        local_128 = CONCAT26(uStack_412,CONCAT24(uStack_414,CONCAT22(uStack_416,local_418)));
        uStack_120 = CONCAT26(uStack_40a,CONCAT24(uStack_40c,CONCAT22(uStack_40e,uStack_410)));
        bVar1 = 0xff < uStack_406;
        bVar16 = uStack_406 != 0;
        bVar31 = uStack_406 < 0x100;
        cVar46 = (char)uStack_406;
        bVar2 = 0xff < uStack_404;
        bVar17 = uStack_404 != 0;
        bVar32 = uStack_404 < 0x100;
        cVar47 = (char)uStack_404;
        bVar3 = 0xff < uStack_402;
        bVar18 = uStack_402 != 0;
        bVar33 = uStack_402 < 0x100;
        cVar48 = (char)uStack_402;
        bVar4 = 0xff < uStack_400;
        bVar19 = uStack_400 != 0;
        bVar34 = uStack_400 < 0x100;
        cVar49 = (char)uStack_400;
        bVar5 = 0xff < uStack_3fe;
        bVar20 = uStack_3fe != 0;
        bVar35 = uStack_3fe < 0x100;
        cVar50 = (char)uStack_3fe;
        bVar6 = 0xff < uStack_3fc;
        bVar21 = uStack_3fc != 0;
        bVar36 = uStack_3fc < 0x100;
        cVar51 = (char)uStack_3fc;
        bVar7 = 0xff < uStack_3fa;
        bVar22 = uStack_3fa != 0;
        bVar37 = uStack_3fa < 0x100;
        cVar52 = (char)uStack_3fa;
        bVar8 = 0xff < local_418;
        bVar23 = local_418 != 0;
        bVar38 = local_418 < 0x100;
        cVar53 = (char)local_418;
        bVar9 = 0xff < uStack_416;
        bVar24 = uStack_416 != 0;
        bVar39 = uStack_416 < 0x100;
        cVar54 = (char)uStack_416;
        bVar10 = 0xff < uStack_414;
        bVar25 = uStack_414 != 0;
        bVar40 = uStack_414 < 0x100;
        cVar55 = (char)uStack_414;
        bVar11 = 0xff < uStack_412;
        bVar26 = uStack_412 != 0;
        bVar41 = uStack_412 < 0x100;
        cVar56 = (char)uStack_412;
        bVar12 = 0xff < uStack_410;
        bVar27 = uStack_410 != 0;
        bVar42 = uStack_410 < 0x100;
        cVar57 = (char)uStack_410;
        bVar13 = 0xff < uStack_40e;
        bVar28 = uStack_40e != 0;
        bVar43 = uStack_40e < 0x100;
        cVar58 = (char)uStack_40e;
        bVar14 = 0xff < uStack_40c;
        bVar29 = uStack_40c != 0;
        bVar44 = uStack_40c < 0x100;
        cVar59 = (char)uStack_40c;
        bVar15 = 0xff < uStack_40a;
        bVar30 = uStack_40a != 0;
        bVar45 = uStack_40a < 0x100;
        cVar60 = (char)uStack_40a;
        lVar78 = (long)local_480;
        lVar79 = lVar78 * 0x10;
        local_268 = auVar84;
        local_258 = auVar83;
        local_228 = uVar61;
        uStack_220 = uVar62;
        local_218 = uVar63;
        uStack_210 = uVar64;
        local_208 = uVar66;
        uStack_200 = uVar67;
        local_1f8 = uVar68;
        uStack_1f0 = uVar69;
        local_1b8 = uVar70;
        uStack_1b0 = uVar71;
        local_188 = uVar72;
        uStack_180 = uVar73;
        local_178 = uVar74;
        uStack_170 = uVar75;
        *(char *)(&local_438 + lVar78 * 2) =
             (local_408 != 0) * (local_408 < 0x100) * (char)local_408 - (0xff < local_408);
        *(char *)((long)&local_438 + lVar79 + 1) = bVar16 * bVar31 * cVar46 - bVar1;
        *(char *)((long)&local_438 + lVar79 + 2) = bVar17 * bVar32 * cVar47 - bVar2;
        *(char *)((long)&local_438 + lVar79 + 3) = bVar18 * bVar33 * cVar48 - bVar3;
        *(char *)((long)&local_438 + lVar79 + 4) = bVar19 * bVar34 * cVar49 - bVar4;
        *(char *)((long)&local_438 + lVar79 + 5) = bVar20 * bVar35 * cVar50 - bVar5;
        *(char *)((long)&local_438 + lVar79 + 6) = bVar21 * bVar36 * cVar51 - bVar6;
        *(char *)((long)&local_438 + lVar79 + 7) = bVar22 * bVar37 * cVar52 - bVar7;
        *(char *)(&uStack_430 + lVar78 * 2) = bVar23 * bVar38 * cVar53 - bVar8;
        *(char *)((long)&uStack_430 + lVar79 + 1) = bVar24 * bVar39 * cVar54 - bVar9;
        *(char *)((long)&uStack_430 + lVar79 + 2) = bVar25 * bVar40 * cVar55 - bVar10;
        *(char *)((long)&uStack_430 + lVar79 + 3) = bVar26 * bVar41 * cVar56 - bVar11;
        *(char *)((long)&uStack_430 + lVar79 + 4) = bVar27 * bVar42 * cVar57 - bVar12;
        *(char *)((long)&uStack_430 + lVar79 + 5) = bVar28 * bVar43 * cVar58 - bVar13;
        *(char *)((long)&uStack_430 + lVar79 + 6) = bVar29 * bVar44 * cVar59 - bVar14;
        *(char *)((long)&uStack_430 + lVar79 + 7) = bVar30 * bVar45 * cVar60 - bVar15;
      }
      local_480 = local_480 + 1;
    }
    uVar61 = *(undefined8 *)Mask[0][local_460];
    uVar62 = *(undefined8 *)(Mask[0][local_460] + 8);
    auVar65._8_8_ = uStack_3b0;
    auVar65._0_8_ = local_3b8;
    auVar85._8_8_ = uStack_430;
    auVar85._0_8_ = local_438;
    auVar83 = pblendvb(auVar65,auVar85,(undefined1  [16])Mask[0][local_460]);
    *(undefined1 (*) [16])(local_348 + (long)local_3e0 * 2) = auVar83;
    uVar63 = *(undefined8 *)Mask[1][local_460];
    uVar64 = *(undefined8 *)(Mask[1][local_460] + 8);
    auVar84._8_8_ = uStack_3b0;
    auVar84._0_8_ = local_3b8;
    auVar83._8_8_ = uStack_420;
    auVar83._0_8_ = local_428;
    auVar83 = pblendvb(auVar84,auVar83,(undefined1  [16])Mask[1][local_460]);
    *(undefined1 (*) [16])(local_350 + (long)local_3e0 * 2) = auVar83;
    local_3dc = local_360 + local_3dc;
    local_3e0 = local_3e0 + 1;
    local_478 = uVar80;
    uStack_476 = uVar86;
    uStack_474 = uVar88;
    uStack_472 = uVar90;
    uStack_470 = uVar92;
    uStack_46e = uVar95;
    uStack_46c = uVar97;
    uStack_46a = uVar99;
    local_108 = uVar63;
    uStack_100 = uVar64;
    local_e8 = local_3b8;
    uStack_e0 = uStack_3b0;
    local_d8 = uVar61;
    uStack_d0 = uVar62;
    local_b8 = local_3b8;
    uStack_b0 = uStack_3b0;
  }
  for (local_464 = local_3e0; local_464 < local_33c; local_464 = local_464 + 1) {
    local_348[(long)local_464 * 2] = local_3b8;
    (local_348 + (long)local_464 * 2)[1] = uStack_3b0;
    local_350[(long)local_464 * 2] = local_3b8;
    (local_350 + (long)local_464 * 2)[1] = uStack_3b0;
  }
LAB_00548255:
  for (local_8ec = 8; local_8ec < 0x10; local_8ec = local_8ec + 1) {
    local_18 = 0;
    uStack_10 = 0;
    local_5e8[(long)local_8ec * 2] = 0;
    local_5e8[(long)local_8ec * 2 + 1] = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_7e8[(long)local_8ec * 2] = 0;
    local_7e8[(long)local_8ec * 2 + 1] = 0;
  }
  local_4d8 = in_RSI;
  local_4d0 = in_RDI;
  transpose16x16_sse2(in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  transpose16x16_sse2(in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  for (local_8f0 = 0; local_8f0 < 0x10; local_8f0 = local_8f0 + 1) {
    *(undefined8 *)(local_4d0 + local_8f0 * local_4d8) = local_768[(long)local_8f0 * 2 + 0x10];
  }
  for (local_8f4 = 0; local_8f4 < 0x10; local_8f4 = local_8f4 + 1) {
    *(undefined8 *)(local_4d0 + (local_8f4 + 0x10) * local_4d8) = local_8e8[(long)local_8f4 * 2];
  }
  return;
}

Assistant:

static void dr_prediction_z3_8x32_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *left, int upsample_left,
                                         int dy) {
  __m128i dstvec[16], d[16], dstvec_h[16], d_h[16];

  dr_prediction_z1_32xN_internal_sse4_1(8, dstvec, dstvec_h, left,
                                        upsample_left, dy);
  for (int i = 8; i < 16; i++) {
    dstvec[i] = _mm_setzero_si128();
    dstvec_h[i] = _mm_setzero_si128();
  }
  transpose16x16_sse2(dstvec, d);
  transpose16x16_sse2(dstvec_h, d_h);

  for (int i = 0; i < 16; i++) {
    _mm_storel_epi64((__m128i *)(dst + i * stride), d[i]);
  }
  for (int i = 0; i < 16; i++) {
    _mm_storel_epi64((__m128i *)(dst + (i + 16) * stride), d_h[i]);
  }
}